

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_gated_linear_attn
          (ggml_context *ctx,ggml_tensor *k,ggml_tensor *v,ggml_tensor *q,ggml_tensor *g,
          ggml_tensor *state,float scale)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Bool _Var5;
  int64_t iVar6;
  ggml_tensor *tensor;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_R8;
  ggml_tensor *in_R9;
  float in_XMM0_Da;
  ggml_tensor *result;
  int64_t ne [4];
  int64_t n_seqs;
  int64_t n_tokens;
  int64_t H;
  int64_t S;
  int in_stack_ffffffffffffff78;
  ggml_type in_stack_ffffffffffffff7c;
  ggml_context *in_stack_ffffffffffffff80;
  
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x153068);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12a7,"GGML_ASSERT(%s) failed","ggml_is_contiguous(k)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x153097);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12a8,"GGML_ASSERT(%s) failed","ggml_is_contiguous(v)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x1530c6);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12a9,"GGML_ASSERT(%s) failed","ggml_is_contiguous(q)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x1530f5);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12aa,"GGML_ASSERT(%s) failed","ggml_is_contiguous(g)");
  }
  _Var5 = ggml_is_contiguous((ggml_tensor *)0x153124);
  if (!_Var5) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12ab,"GGML_ASSERT(%s) failed","ggml_is_contiguous(state)");
  }
  lVar1 = in_RSI->ne[0];
  lVar2 = in_RSI->ne[1];
  lVar3 = in_RSI->ne[2];
  lVar4 = in_R9->ne[1];
  if (((in_RDX->ne[0] != lVar1) || (in_RDX->ne[1] != lVar2)) || (in_RDX->ne[2] != lVar3)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12b2,"GGML_ASSERT(%s) failed",
               "v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens");
  }
  if (((in_RCX->ne[0] != lVar1) || (in_RCX->ne[1] != lVar2)) || (in_RCX->ne[2] != lVar3)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x12b3,"GGML_ASSERT(%s) failed",
               "q->ne[0] == S && q->ne[1] == H && q->ne[2] == n_tokens");
  }
  if (((in_R8->ne[0] == lVar1) && (in_R8->ne[1] == lVar2)) && (in_R8->ne[2] == lVar3)) {
    iVar6 = ggml_nelements(in_R9);
    if (iVar6 != lVar1 * lVar1 * lVar2 * lVar4) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x12b5,"GGML_ASSERT(%s) failed","ggml_nelements(state) == S * S * H * n_seqs");
    }
    tensor = ggml_new_tensor(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                             in_stack_ffffffffffffff78,(int64_t *)0x15330e);
    ggml_set_op_params_f32(tensor,0,in_XMM0_Da);
    tensor->op = GGML_OP_GATED_LINEAR_ATTN;
    tensor->src[0] = in_RSI;
    tensor->src[1] = in_RDX;
    tensor->src[2] = in_RCX;
    tensor->src[3] = in_R8;
    tensor->src[4] = in_R9;
    return tensor;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x12b4,
             "GGML_ASSERT(%s) failed","g->ne[0] == S && g->ne[1] == H && g->ne[2] == n_tokens");
}

Assistant:

struct ggml_tensor * ggml_gated_linear_attn(
        struct ggml_context * ctx,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * q,
        struct ggml_tensor  * g,
        struct ggml_tensor  * state,
        float scale) {
    GGML_ASSERT(ggml_is_contiguous(k));
    GGML_ASSERT(ggml_is_contiguous(v));
    GGML_ASSERT(ggml_is_contiguous(q));
    GGML_ASSERT(ggml_is_contiguous(g));
    GGML_ASSERT(ggml_is_contiguous(state));

    const int64_t S = k->ne[0];
    const int64_t H = k->ne[1];
    const int64_t n_tokens = k->ne[2];
    const int64_t n_seqs = state->ne[1];
    {
        GGML_ASSERT(v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens);
        GGML_ASSERT(q->ne[0] == S && q->ne[1] == H && q->ne[2] == n_tokens);
        GGML_ASSERT(g->ne[0] == S && g->ne[1] == H && g->ne[2] == n_tokens);
        GGML_ASSERT(ggml_nelements(state) == S * S * H * n_seqs);
    }

    // concat output and new_state
    const int64_t ne[4] = { S * H, n_tokens + S * n_seqs, 1, 1 };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    ggml_set_op_params_f32(result, 0, scale);

    result->op     = GGML_OP_GATED_LINEAR_ATTN;
    result->src[0] = k;
    result->src[1] = v;
    result->src[2] = q;
    result->src[3] = g;
    result->src[4] = state;

    return result;
}